

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O3

int Lodtalk::CompiledMethod::stDump(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var2;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    dump((CompiledMethod *)CONCAT44(extraout_var_00,iVar1));
    pp_Var2 = interpreter->_vptr_InterpreterProxy + 0x12;
  }
  else {
    pp_Var2 = interpreter->_vptr_InterpreterProxy + 0x1e;
  }
  iVar1 = (**pp_Var2)(interpreter);
  return iVar1;
}

Assistant:

int CompiledMethod::stDump(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);
    self->dump();
    return interpreter->returnReceiver();
}